

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_ray_tracing.cpp
# Opt level: O0

bool dxil_spv::emit_ray_tracing_builtin_load_instruction
               (Impl *impl,CallInst *inst,BuiltIn builtin,Id scalar_type)

{
  Id IVar1;
  Id type_id;
  Builder *this;
  Operation *this_00;
  Value *value;
  Operation *this_01;
  Operation *load;
  Operation *access_chain;
  Id input;
  Builder *builder;
  Id scalar_type_local;
  BuiltIn builtin_local;
  CallInst *inst_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  IVar1 = SPIRVModule::get_builtin_shader_input(impl->spirv_module,builtin);
  type_id = spv::Builder::makePointer(this,StorageClassInput,scalar_type);
  this_00 = Converter::Impl::allocate(impl,OpAccessChain,type_id);
  Operation::add_id(this_00,IVar1);
  value = LLVMBC::Instruction::getOperand(&inst->super_Instruction,1);
  IVar1 = Converter::Impl::get_id_for_value(impl,value,0x20);
  Operation::add_id(this_00,IVar1);
  Converter::Impl::add(impl,this_00,false);
  this_01 = Converter::Impl::allocate(impl,OpLoad,(Value *)inst);
  Operation::add_id(this_01,this_00->id);
  Converter::Impl::add(impl,this_01,false);
  return true;
}

Assistant:

bool emit_ray_tracing_builtin_load_instruction(Converter::Impl &impl, const llvm::CallInst *inst,
                                               spv::BuiltIn builtin, spv::Id scalar_type)
{
	auto &builder = impl.builder();
	spv::Id input = impl.spirv_module.get_builtin_shader_input(builtin);

	auto *access_chain = impl.allocate(spv::OpAccessChain, builder.makePointer(spv::StorageClassInput, scalar_type));
	access_chain->add_id(input);
	access_chain->add_id(impl.get_id_for_value(inst->getOperand(1), 32));
	impl.add(access_chain);

	auto *load = impl.allocate(spv::OpLoad, inst);
	load->add_id(access_chain->id);
	impl.add(load);
	return true;
}